

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O0

bool * __thiscall kj::_::NullableValue<bool>::emplace<bool>(NullableValue<bool> *this,bool *params)

{
  bool *params_00;
  bool *params_local;
  NullableValue<bool> *this_local;
  
  if ((this->isSet & 1U) != 0) {
    this->isSet = false;
    dtor<bool>(&(this->field_1).value);
  }
  params_00 = fwd<bool>(params);
  ctor<bool,bool>(&(this->field_1).value,params_00);
  this->isSet = true;
  return (bool *)&this->field_1;
}

Assistant:

inline T& emplace(Params&&... params) {
    if (isSet) {
      isSet = false;
      dtor(value);
    }
    ctor(value, kj::fwd<Params>(params)...);
    isSet = true;
    return value;
  }